

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int32_t zng_inflateValidate(zng_stream *strm,int32_t check)

{
  int iVar1;
  int32_t iVar2;
  uint uVar3;
  
  iVar1 = inflateStateCheck(strm);
  if (iVar1 == 0) {
    uVar3 = *(uint *)&strm->state->pending_out;
    if (check == 0) {
      uVar3 = uVar3 & 0xfffffffb;
    }
    else if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar3 | 4;
    }
    *(uint *)&strm->state->pending_out = uVar3;
    iVar2 = 0;
  }
  else {
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateValidate)(PREFIX3(stream) *strm, int32_t check) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if (check && state->wrap)
        state->wrap |= 4;
    else
        state->wrap &= ~4;
    return Z_OK;
}